

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::serialize_multipart_formdata_item_begin<httplib::MultipartFormData>
                   (string *__return_storage_ptr__,MultipartFormData *item,string *boundary)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  string *local_20;
  string *boundary_local;
  MultipartFormData *item_local;
  string *body;
  
  local_21 = 0;
  local_20 = boundary;
  boundary_local = &item->name;
  item_local = (MultipartFormData *)__return_storage_ptr__;
  std::operator+(&local_48,"--",boundary);
  std::operator+(__return_storage_ptr__,&local_48,"\r\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::operator+(&local_98,"Content-Disposition: form-data; name=\"",boundary_local);
  std::operator+(&local_78,&local_98,"\"");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (boundary_local + 2);
  if (!bVar1) {
    std::operator+(&local_d8,"; filename=\"",boundary_local + 2);
    std::operator+(&local_b8,&local_d8,"\"");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,"\r\n");
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (boundary_local + 3);
  if (!bVar1) {
    std::operator+(&local_118,"Content-Type: ",boundary_local + 3);
    std::operator+(&local_f8,&local_118,"\r\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,"\r\n");
  return __return_storage_ptr__;
}

Assistant:

inline std::string
serialize_multipart_formdata_item_begin(const T &item,
                                        const std::string &boundary) {
  std::string body = "--" + boundary + "\r\n";
  body += "Content-Disposition: form-data; name=\"" + item.name + "\"";
  if (!item.filename.empty()) {
    body += "; filename=\"" + item.filename + "\"";
  }
  body += "\r\n";
  if (!item.content_type.empty()) {
    body += "Content-Type: " + item.content_type + "\r\n";
  }
  body += "\r\n";

  return body;
}